

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_example.c
# Opt level: O1

dropt_error handle_face(dropt_context *context,dropt_option *option,char *optionArgument,void *dest)

{
  int iVar1;
  undefined4 uVar2;
  dropt_error dVar3;
  
  if (dest == (void *)0x0) {
    __assert_fail("face != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/dropt_example.c"
                  ,0x92,
                  "dropt_error handle_face(dropt_context *, const dropt_option *, const char *, void *)"
                 );
  }
  dVar3 = 5;
  if ((optionArgument != (char *)0x0) && (*optionArgument != '\0')) {
    iVar1 = strcmp(optionArgument,"heads");
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = strcmp(optionArgument,"tails");
      if (iVar1 != 0) {
        return 6;
      }
      uVar2 = 2;
    }
    *(undefined4 *)dest = uVar2;
    dVar3 = 0;
  }
  return dVar3;
}

Assistant:

static dropt_error
handle_face(dropt_context* context,
            const dropt_option* option,
            const char* optionArgument,
            void* dest)
{
    dropt_error err = dropt_error_none;
    face_type* face = dest;
    assert(face != NULL);

    /* Option handlers should handle `optionArgument` being `NULL` (if the
     * option's argument is optional and wasn't supplied) or being the empty
     * string (if a user explicitly passed an empty string (e.g. --face="").
     */
    if (optionArgument == NULL || optionArgument[0] == '\0')
    {
        err = dropt_error_insufficient_arguments;
    }
    else if (strcmp(optionArgument, "heads") == 0)
    {
        *face = heads;
    }
    else if (strcmp(optionArgument, "tails") == 0)
    {
        *face = tails;
    }
    else
    {
        /* Reject the value as being inappropriate for this handler. */
        err = dropt_error_mismatch;
    }

    return err;
}